

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtextdocumentlayout.cpp
# Opt level: O0

QFixed __thiscall
QTextDocumentLayoutPrivate::blockIndent
          (QTextDocumentLayoutPrivate *this,QTextBlockFormat *blockFormat)

{
  bool bVar1;
  int iVar2;
  QTextObject *pQVar3;
  long in_RDI;
  long in_FS_OFFSET;
  qreal scale;
  QTextObject *object;
  qreal indent;
  undefined4 in_stack_ffffffffffffff88;
  undefined4 in_stack_ffffffffffffff8c;
  QTextDocument *in_stack_ffffffffffffff90;
  QTextObject *in_stack_ffffffffffffff98;
  double local_58;
  double local_48;
  QFixed local_2c [9];
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  iVar2 = QTextBlockFormat::indent((QTextBlockFormat *)0x7f93a4);
  local_48 = (double)iVar2;
  pQVar3 = QTextDocument::objectForFormat
                     (in_stack_ffffffffffffff90,
                      (QTextFormat *)CONCAT44(in_stack_ffffffffffffff8c,in_stack_ffffffffffffff88));
  if (pQVar3 != (QTextObject *)0x0) {
    QTextObject::format(in_stack_ffffffffffffff98);
    QTextFormat::toListFormat
              ((QTextFormat *)CONCAT44(in_stack_ffffffffffffff8c,in_stack_ffffffffffffff88));
    iVar2 = QTextListFormat::indent((QTextListFormat *)0x7f93fb);
    local_48 = (double)iVar2 + local_48;
    QTextListFormat::~QTextListFormat((QTextListFormat *)0x7f9415);
    QTextFormat::~QTextFormat((QTextFormat *)0x7f941f);
  }
  bVar1 = qIsNull(local_48);
  if (bVar1) {
    QFixed::QFixed(local_2c,0);
  }
  else {
    local_58 = 1.0;
    if (*(long *)(in_RDI + 0x80) != 0) {
      iVar2 = QPaintDevice::logicalDpiY((QPaintDevice *)0x7f946f);
      local_58 = (double)iVar2;
      iVar2 = qt_defaultDpi();
      local_58 = local_58 / (double)iVar2;
    }
    QTextDocument::indentWidth((QTextDocument *)(local_48 * local_58));
    local_2c[0] = QFixed::fromReal((qreal)CONCAT44(in_stack_ffffffffffffff8c,
                                                   in_stack_ffffffffffffff88));
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return (QFixed)local_2c[0].val;
  }
  __stack_chk_fail();
}

Assistant:

QFixed QTextDocumentLayoutPrivate::blockIndent(const QTextBlockFormat &blockFormat) const
{
    qreal indent = blockFormat.indent();

    QTextObject *object = document->objectForFormat(blockFormat);
    if (object)
        indent += object->format().toListFormat().indent();

    if (qIsNull(indent))
        return 0;

    qreal scale = 1;
    if (paintDevice) {
        scale = qreal(paintDevice->logicalDpiY()) / qreal(qt_defaultDpi());
    }

    return QFixed::fromReal(indent * scale * document->indentWidth());
}